

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DXFHelper.h
# Opt level: O0

LineReader * __thiscall Assimp::DXF::LineReader::operator++(LineReader *this)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  string *psVar4;
  Logger *this_00;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *this_01;
  basic_formatter *this_02;
  bool bVar5;
  logic_error *anon_var_0;
  string local_70;
  unsigned_long local_50;
  size_t cnt;
  LineReader *local_18;
  LineReader *this_local;
  
  if (this->end == 0) {
    local_18 = this;
    LineSplitter::operator->[abi_cxx11_(&this->splitter);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    iVar1 = strtol10(pcVar2,(char **)0x0);
    this->groupcode = iVar1;
    LineSplitter::operator++(&this->splitter,0);
    LineSplitter::operator*[abi_cxx11_((string *)&cnt,&this->splitter);
    std::__cxx11::string::operator=((string *)&this->value,(string *)&cnt);
    std::__cxx11::string::~string((string *)&cnt);
    LineSplitter::operator++(&this->splitter,0);
    lVar3 = std::__cxx11::string::length();
    if ((lVar3 != 0) &&
       (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)&this->value), *pcVar2 == '{')) {
      local_50 = 0;
      while( true ) {
        LineSplitter::operator->[abi_cxx11_(&this->splitter);
        lVar3 = std::__cxx11::string::length();
        bVar5 = false;
        if (lVar3 != 0) {
          psVar4 = LineSplitter::operator->[abi_cxx11_(&this->splitter);
          pcVar2 = (char *)std::__cxx11::string::at((ulong)psVar4);
          bVar5 = *pcVar2 != '}';
        }
        if (!bVar5) break;
        LineSplitter::operator++(&this->splitter,0);
        local_50 = local_50 + 1;
      }
      LineSplitter::operator++(&this->splitter,0);
      this_00 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[34]>
                ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)&anon_var_0
                 ,(char (*) [34])"DXF: skipped over control group (");
      this_01 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                          &anon_var_0,&local_50);
      this_02 = (basic_formatter *)
                Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                operator_(this_01,(char (*) [8])" lines)");
      Formatter::basic_formatter::operator_cast_to_string(&local_70,this_02);
      Logger::debug(this_00,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      ~basic_formatter((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &anon_var_0);
    }
    bVar5 = LineSplitter::operator_cast_to_bool(&this->splitter);
    if (!bVar5) {
      this->end = 1;
    }
  }
  else if (this->end == 1) {
    this->end = this->end + 1;
  }
  return this;
}

Assistant:

LineReader& operator++() {
        if (end) {
            if (end == 1) {
                ++end;
            }
            return *this;
        }

        try {
            groupcode = strtol10(splitter->c_str());
            splitter++;

            value = *splitter;
            splitter++;

            // automatically skip over {} meta blocks (these are for application use
            // and currently not relevant for Assimp).
            if (value.length() && value[0] == '{') {

                size_t cnt = 0;
                for(;splitter->length() && splitter->at(0) != '}'; splitter++, cnt++);

                splitter++;
                ASSIMP_LOG_DEBUG((Formatter::format("DXF: skipped over control group ("),cnt," lines)"));
            }
        } catch(std::logic_error&) {
            ai_assert(!splitter);
        }
        if (!splitter) {
            end = 1;
        }
        return *this;
    }